

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O3

int tclpkcs11_closesession(ClientData cd,Tcl_Interp *interp,int objc,Tcl_Obj **objv)

{
  long lVar1;
  Tcl_Obj *pTVar2;
  char *pcVar3;
  ProcErrorProc *pPVar4;
  
  if (cd == (ClientData)0x0) {
    pPVar4 = tclStubsPtr->tcl_SetObjResult;
    pcVar3 = "invalid clientdata";
  }
  else if (objc == 2) {
    lVar1 = (**(code **)((long)cd + 0x40))(cd,objv[1]);
    if ((lVar1 != 0) && (lVar1 = *(long *)(lVar1 + 0x18), lVar1 != 0)) {
      if (*(int *)(lVar1 + 0x10) != 0) {
        *(undefined4 *)(lVar1 + 0x10) = 0;
        (**(code **)(*(long *)(lVar1 + 8) + 0x70))(*(undefined8 *)(lVar1 + 0x20));
      }
      pPVar4 = tclStubsPtr->tcl_SetObjResult;
      pTVar2 = (*tclStubsPtr->tcl_NewIntObj)(1);
      (*pPVar4)((Tcl_Interp_conflict *)interp,pTVar2);
      return 0;
    }
    pPVar4 = tclStubsPtr->tcl_SetObjResult;
    pcVar3 = "invalid handle";
  }
  else {
    pPVar4 = tclStubsPtr->tcl_SetObjResult;
    pcVar3 = "wrong # args: should be \"pki::pkcs11::closesession handle\"";
  }
  pTVar2 = (*tclStubsPtr->tcl_NewStringObj)(pcVar3,-1);
  (*pPVar4)((Tcl_Interp_conflict *)interp,pTVar2);
  return 1;
}

Assistant:

MODULE_SCOPE int tclpkcs11_closesession(ClientData cd, Tcl_Interp *interp, int objc, Tcl_Obj *CONST objv[]) {
  struct tclpkcs11_interpdata *interpdata;
  struct tclpkcs11_handle *handle;
  Tcl_HashEntry *tcl_handle_entry;
  Tcl_Obj *tcl_handle;

  if (!cd) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid clientdata", -1));

    return(TCL_ERROR);
  }

  if (objc != 2) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("wrong # args: should be \"pki::pkcs11::closesession handle\"", -1));

    return(TCL_ERROR);
  }

  tcl_handle = objv[1];

  interpdata = (struct tclpkcs11_interpdata *) cd;

  tcl_handle_entry = Tcl_FindHashEntry(&interpdata->handles, (const char *) tcl_handle);
  if (!tcl_handle_entry) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  handle = (struct tclpkcs11_handle *) Tcl_GetHashValue(tcl_handle_entry);
  if (!handle) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  /* Close the session, cleaning up all the session objects */
  tclpkcs11_close_session(handle);

  Tcl_SetObjResult(interp, Tcl_NewBooleanObj(1));

  return(TCL_OK);
}